

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_serial(uchar **p,uchar *end,mbedtls_x509_buf *serial)

{
  byte *pbVar1;
  uchar *puVar2;
  int iVar3;
  
  pbVar1 = *p;
  if (end != pbVar1 && -1 < (long)end - (long)pbVar1) {
    if ((*pbVar1 | 0x80) == 0x82) {
      *p = pbVar1 + 1;
      serial->tag = (uint)*pbVar1;
      iVar3 = mbedtls_asn1_get_len(p,end,&serial->len);
      if (iVar3 == 0) {
        puVar2 = *p;
        serial->p = puVar2;
        *p = puVar2 + serial->len;
        iVar3 = 0;
      }
      else {
        iVar3 = iVar3 + -0x2280;
      }
    }
    else {
      iVar3 = -0x22e2;
    }
    return iVar3;
  }
  return -0x22e0;
}

Assistant:

int mbedtls_x509_get_serial(unsigned char **p, const unsigned char *end,
                            mbedtls_x509_buf *serial)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((end - *p) < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_SERIAL,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    if (**p != (MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_PRIMITIVE | 2) &&
        **p !=   MBEDTLS_ASN1_INTEGER) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_SERIAL,
                                 MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
    }

    serial->tag = *(*p)++;

    if ((ret = mbedtls_asn1_get_len(p, end, &serial->len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_SERIAL, ret);
    }

    serial->p = *p;
    *p += serial->len;

    return 0;
}